

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

vector<duckdb::ColumnSegmentInfo,_true> * __thiscall
duckdb::RowGroupCollection::GetColumnSegmentInfo
          (vector<duckdb::ColumnSegmentInfo,_true> *__return_storage_ptr__,RowGroupCollection *this)

{
  RowGroupSegmentTree *this_00;
  RowGroup *this_01;
  RowGroup *row_group;
  
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>).
  super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>).
  super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>).
  super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  for (this_01 = SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
                           (&this_00->super_SegmentTree<duckdb::RowGroup,_true>);
      this_01 != (RowGroup *)0x0;
      this_01 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                          (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,this_01)) {
    RowGroup::GetColumnSegmentInfo
              (this_01,(this_01->super_SegmentBase<duckdb::RowGroup>).index,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnSegmentInfo> RowGroupCollection::GetColumnSegmentInfo() {
	vector<ColumnSegmentInfo> result;
	for (auto &row_group : row_groups->Segments()) {
		row_group.GetColumnSegmentInfo(row_group.index, result);
	}
	return result;
}